

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

Arena * absl::lts_20250127::base_internal::LowLevelAlloc::NewArena(uint32_t flags)

{
  Arena *this;
  undefined1 *arena;
  
  if (base_internal::(anonymous_namespace)::create_globals_once != 0xdd) {
    NewArena();
  }
  if ((flags & 2) == 0) {
    if ((flags & 1) != 0) {
      arena = base_internal::(anonymous_namespace)::default_arena_storage;
      goto LAB_004d10a6;
    }
    arena = base_internal::(anonymous_namespace)::unhooked_arena_storage;
  }
  else {
    arena = base_internal::(anonymous_namespace)::unhooked_async_sig_safe_arena_storage;
  }
  if (base_internal::(anonymous_namespace)::create_globals_once != 0xdd) {
    CallOnceImpl<void(&)()>
              ((Nonnull<std::atomic<uint32_t>_*>)
               &base_internal::(anonymous_namespace)::create_globals_once,SCHEDULE_KERNEL_ONLY,
               base_internal::anon_unknown_0::CreateGlobalArenas);
  }
LAB_004d10a6:
  this = (Arena *)AllocWithArena(0x148,(Arena *)arena);
  Arena::Arena(this,flags);
  return this;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArena(uint32_t flags) {
  Arena *meta_data_arena = DefaultArena();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
  if ((flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
    meta_data_arena = UnhookedAsyncSigSafeArena();
  } else  // NOLINT(readability/braces)
#endif
      if ((flags & LowLevelAlloc::kCallMallocHook) == 0) {
    meta_data_arena = UnhookedArena();
  }
  Arena *result =
      new (AllocWithArena(sizeof(*result), meta_data_arena)) Arena(flags);
  return result;
}